

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrgls_api.hpp
# Opt level: O0

vector<hrgls::Message,_std::allocator<hrgls::Message>_> * __thiscall
hrgls::API::GetPendingLogMessages
          (vector<hrgls::Message,_std::allocator<hrgls::Message>_> *__return_storage_ptr__,API *this
          ,size_t maxNum)

{
  API_private *pAVar1;
  mapped_type mVar2;
  mapped_type *pmVar3;
  size_type sVar4;
  bool bVar5;
  Message local_70;
  key_type local_68;
  key_type local_60;
  key_type local_58;
  key_type local_50;
  hrgls_Message local_48;
  hrgls_Message m;
  key_type local_30;
  undefined1 local_21;
  size_t local_20;
  size_t maxNum_local;
  API *this_local;
  vector<hrgls::Message,_std::allocator<hrgls::Message>_> *ret;
  
  local_21 = 0;
  local_20 = maxNum;
  maxNum_local = (size_t)this;
  this_local = (API *)__return_storage_ptr__;
  std::vector<hrgls::Message,_std::allocator<hrgls::Message>_>::vector(__return_storage_ptr__);
  if (this->m_private != (API_private *)0x0) {
    pAVar1 = this->m_private;
    local_30._M_thread = (native_handle_type)std::this_thread::get_id();
    pmVar3 = std::
             map<std::thread::id,_int,_std::less<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_int>_>_>
             ::operator[](&pAVar1->m_status,&local_30);
    *pmVar3 = 0;
    while (sVar4 = std::vector<hrgls::Message,_std::allocator<hrgls::Message>_>::size
                             (__return_storage_ptr__), sVar4 < local_20 || local_20 == 0) {
      local_48 = (hrgls_Message)0x0;
      mVar2 = hrgls_APIGetNextLogMessage(this->m_private->m_api,&local_48);
      pAVar1 = this->m_private;
      local_50._M_thread = (native_handle_type)std::this_thread::get_id();
      pmVar3 = std::
               map<std::thread::id,_int,_std::less<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_int>_>_>
               ::operator[](&pAVar1->m_status,&local_50);
      *pmVar3 = mVar2;
      pAVar1 = this->m_private;
      local_58._M_thread = (native_handle_type)std::this_thread::get_id();
      pmVar3 = std::
               map<std::thread::id,_int,_std::less<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_int>_>_>
               ::operator[](&pAVar1->m_status,&local_58);
      if (*pmVar3 != 0) {
        hrgls_MessageDestroy(local_48);
        pAVar1 = this->m_private;
        local_60._M_thread = (native_handle_type)std::this_thread::get_id();
        pmVar3 = std::
                 map<std::thread::id,_int,_std::less<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_int>_>_>
                 ::operator[](&pAVar1->m_status,&local_60);
        bVar5 = false;
        if (*pmVar3 == 1) {
          sVar4 = std::vector<hrgls::Message,_std::allocator<hrgls::Message>_>::size
                            (__return_storage_ptr__);
          bVar5 = sVar4 != 0;
        }
        if (!bVar5) {
          return __return_storage_ptr__;
        }
        pAVar1 = this->m_private;
        local_68._M_thread = (native_handle_type)std::this_thread::get_id();
        pmVar3 = std::
                 map<std::thread::id,_int,_std::less<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_int>_>_>
                 ::operator[](&pAVar1->m_status,&local_68);
        *pmVar3 = 0;
        return __return_storage_ptr__;
      }
      Message::Message(&local_70,local_48);
      std::vector<hrgls::Message,_std::allocator<hrgls::Message>_>::push_back
                (__return_storage_ptr__,&local_70);
      Message::~Message(&local_70);
      hrgls_MessageDestroy(local_48);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Message> API::GetPendingLogMessages(size_t maxNum)
  {
    std::vector<Message> ret;
    if (!m_private) {
      return ret;
    }

    // Keep getting messages until we either have enough or get a status other
    // than OKAY.  Push each onto the vector, then destroy it.
    m_private->m_status[std::this_thread::get_id()] = hrgls_STATUS_OKAY;
    while ((ret.size() < maxNum) || (maxNum == 0)) {
      hrgls_Message m = nullptr;
      m_private->m_status[std::this_thread::get_id()] = hrgls_APIGetNextLogMessage(m_private->m_api, &m);
      if (m_private->m_status[std::this_thread::get_id()] != hrgls_STATUS_OKAY) {
        hrgls_MessageDestroy(m);
        if ((m_private->m_status[std::this_thread::get_id()] == hrgls_STATUS_TIMEOUT) &&
            (ret.size() > 0)) {
          // We got at least one message before timing out, so things are
          // okay.
          m_private->m_status[std::this_thread::get_id()] = hrgls_STATUS_OKAY;
        }
        return ret;
      }
      ret.push_back(m);
      hrgls_MessageDestroy(m);
    }

    return ret;
  }